

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_EditionDefaultsInvalidMinimumUnknown_Test::
~CommandLineInterfaceTest_EditionDefaultsInvalidMinimumUnknown_Test
          (CommandLineInterfaceTest_EditionDefaultsInvalidMinimumUnknown_Test *this)

{
  CommandLineInterfaceTest_EditionDefaultsInvalidMinimumUnknown_Test *this_local;
  
  ~CommandLineInterfaceTest_EditionDefaultsInvalidMinimumUnknown_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, EditionDefaultsInvalidMinimumUnknown) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  Run("protocol_compiler --proto_path=$tmpdir "
      "--edition_defaults_minimum=2022 "
      "google/protobuf/descriptor.proto");
  ExpectErrorSubstring("unknown edition \"2022\"");
}